

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::
emplaceRealloc<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<slang::parsing::Trivia> *this,pointer pos,TriviaKind *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  Trivia *this_00;
  ulong uVar1;
  pointer p;
  string_view rawText;
  undefined8 uVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pTVar3 = (pointer)operator_new(uVar8 << 4);
  this_00 = (Trivia *)((long)pTVar3 + lVar9);
  rawText._M_len = args_1->_M_len;
  rawText._M_str = args_1->_M_str;
  parsing::Trivia::Trivia(this_00,*args,rawText);
  p = this->data_;
  sVar7 = this->len;
  lVar6 = (long)p + (sVar7 * 0x10 - (long)pos);
  pTVar4 = p;
  pTVar5 = pTVar3;
  if (lVar6 == 0) {
    pTVar4 = pTVar3;
    pTVar5 = p;
    if (sVar7 != 0) {
      do {
        uVar2 = *(undefined8 *)((long)&pTVar5->field_0 + 8);
        (pTVar4->field_0).rawText.ptr = (pTVar5->field_0).rawText.ptr;
        *(undefined8 *)((long)&pTVar4->field_0 + 8) = uVar2;
        pTVar5 = pTVar5 + 1;
        pTVar4 = pTVar4 + 1;
      } while (pTVar5 != pos);
    }
  }
  else {
    for (; pTVar4 != pos; pTVar4 = pTVar4 + 1) {
      uVar2 = *(undefined8 *)((long)&pTVar4->field_0 + 8);
      (pTVar5->field_0).rawText.ptr = (pTVar4->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar5->field_0 + 8) = uVar2;
      pTVar5 = pTVar5 + 1;
    }
    memcpy((void *)((long)pTVar3 + lVar9 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pTVar3;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}